

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cExplicitUniformLocationTest.cpp
# Opt level: O0

void __thiscall
glcts::anon_unknown_0::SubroutineIndexLoc::SubroutineIndexLoc(SubroutineIndexLoc *this)

{
  SubroutineIndexLoc *this_local;
  
  ExplicitUniformLocationCaseBase::ExplicitUniformLocationCaseBase
            (&this->super_ExplicitUniformLocationCaseBase);
  (this->super_ExplicitUniformLocationCaseBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper =
       (_func_int **)&PTR__SubroutineIndexLoc_0325af80;
  return;
}

Assistant:

virtual long Run()
	{

		//one shader:

		//subroutine vec4 st0(float param);
		SubroutineFunctionSet functions_st0(uniformValueGenerator);
		//layout(index = 1) subroutine(st0) vec4 sf0(float param) { .... };
		functions_st0.push_back(SubroutineFunction(uniformValueGenerator, Index::C(1)));
		//layout(index = 2) subroutine(st0) vec4 sf1(float param) { .... };
		functions_st0.push_back(SubroutineFunction(uniformValueGenerator, Index::C(2)));

		std::vector<SubroutineUniform> subroutineUniforms;

		//layout(location = 3) subroutine uniform st0 u0;
		subroutineUniforms.push_back(
			SubroutineUniform(uniformValueGenerator, functions_st0, Loc::C(3), 0, DefOccurence::FSH_OR_CSH));
		return doRun(subroutineUniforms);
	}